

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O2

void __thiscall spvtools::opt::SENode::AddChild(SENode *this,SENode *child)

{
  int iVar1;
  undefined4 extraout_var;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  __position;
  SENode *child_local;
  
  child_local = child;
  iVar1 = (*this->_vptr_SENode[4])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                           ((this->children_).
                            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->children_).
                            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,child);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              (&this->children_,(const_iterator)__position._M_current,&child_local);
    return;
  }
  __assert_fail("false && \"Trying to add a child node to a constant!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
}

Assistant:

virtual inline void AddChild(SENode* child) {
    // If this is a constant node, assert.
    if (AsSEConstantNode()) {
      assert(false && "Trying to add a child node to a constant!");
    }

    // Find the first point in the vector where |child| is greater than the node
    // currently in the vector.
    auto find_first_less_than = [child](const SENode* node) {
      return child->unique_id_ <= node->unique_id_;
    };

    auto position = std::find_if_not(children_.begin(), children_.end(),
                                     find_first_less_than);
    // Children are sorted so the hashing and equality operator will be the same
    // for a node with the same children. X+Y should be the same as Y+X.
    children_.insert(position, child);
  }